

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O3

void __thiscall
QTreeView::selectionChanged(QTreeView *this,QItemSelection *selected,QItemSelection *deselected)

{
  QTreeViewPrivate *this_00;
  int *piVar1;
  char cVar2;
  int iVar3;
  code **ppcVar4;
  long in_FS_OFFSET;
  QArrayData *local_a0;
  code **local_98;
  long local_90;
  QModelIndex local_88;
  code *local_68;
  code *pcStack_60;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_58;
  code *local_50;
  undefined8 uStack_48;
  QTreeView *pQStack_40;
  int local_38;
  undefined4 uStack_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  cVar2 = QAccessible::isActive();
  if (cVar2 != '\0') {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    QItemSelection::indexes();
    local_50 = (code *)0xffffffffffffffff;
    uStack_48 = 0;
    pQStack_40 = (QTreeView *)0x0;
    if (local_88.m.ptr == (QAbstractItemModel *)0x0) {
      ppcVar4 = &local_50;
    }
    else {
      ppcVar4 = (code **)CONCAT44(local_88.i._4_4_,(undefined4)local_88.i);
    }
    local_68 = *ppcVar4;
    pcStack_60 = ppcVar4[1];
    local_58.ptr = (QAbstractItemModel *)ppcVar4[2];
    piVar1 = (int *)CONCAT44(local_88.c,local_88.r);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_88.c,local_88.r),0x18,0x10);
      }
    }
    if (((-1 < (int)local_68) && (-1 < (long)local_68)) &&
       (local_58.ptr != (QAbstractItemModel *)0x0)) {
      iVar3 = QTreeViewPrivate::accessibleTree2Index(this_00,(QModelIndex *)&local_68);
      local_50 = QFont::strikeOut;
      uStack_48 = 0xaaaaaaaa00008007;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar3);
      pQStack_40 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
    QItemSelection::indexes();
    local_50 = (code *)0xffffffffffffffff;
    uStack_48 = 0;
    pQStack_40 = (QTreeView *)0x0;
    if (local_90 == 0) {
      local_98 = &local_50;
    }
    local_88.r = *(int *)local_98;
    local_88.c = *(int *)((long)local_98 + 4);
    local_88.i._0_4_ = *(undefined4 *)(local_98 + 1);
    local_88.i._4_4_ = *(undefined4 *)((long)local_98 + 0xc);
    local_88.m.ptr = (QAbstractItemModel *)local_98[2];
    if (local_a0 != (QArrayData *)0x0) {
      LOCK();
      (local_a0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a0,0x18,0x10);
      }
    }
    if (((-1 < local_88.r) && (-1 < local_88.c)) && (local_88.m.ptr != (QAbstractItemModel *)0x0)) {
      iVar3 = QTreeViewPrivate::accessibleTree2Index(this_00,&local_88);
      local_50 = QFont::strikeOut;
      uStack_48 = 0xaaaaaaaa00008008;
      _local_38 = CONCAT44(0xaaaaaaaa,iVar3);
      pQStack_40 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_50);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_50);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
    QAbstractItemView::selectionChanged(selected, deselected);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        Q_D(QTreeView);

        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTree2Index(sel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTree2Index(desel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}